

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O1

void __thiscall
icu_63::CollationIterator::appendNumericSegmentCEs
          (CollationIterator *this,char *digits,int32_t length,UErrorCode *errorCode)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  UBool UVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  
  uVar2 = this->data->numericPrimary;
  if (length < 8) {
    iVar12 = (int)*digits;
    if (1 < length) {
      uVar11 = 1;
      do {
        iVar12 = (int)digits[uVar11] + iVar12 * 10;
        uVar11 = uVar11 + 1;
      } while ((uint)length != uVar11);
    }
    if (iVar12 < 0x4a) {
      uVar11 = (ulong)(iVar12 * 0x10000 + 0x20000U | uVar2);
      goto LAB_0022b4c2;
    }
    if (iVar12 < 0x27fa) {
      uVar5 = iVar12 - 0x4aU >> 1;
      uVar11 = (ulong)((uVar5 / 0x7f) * 0x10000 + 0x4c0000 | uVar2 |
                      ((uVar5 / 0x7f) * 2 + (uVar5 / 0x7f) * -0x100 + iVar12 + -0x4a) * 0x100 +
                      0x200);
      goto LAB_0022b4c2;
    }
    if (iVar12 < 0xfe83a) {
      uVar5 = iVar12 - 0x27faU >> 1;
      uVar9 = iVar12 - 0x27faU >> 2;
      uVar11 = (ulong)(((uVar9 / 0x3e82fe) * -0xfe + uVar9 / 0x3f01) * 0x10000 + 0x740000 | uVar2 |
                      ((int)(((ulong)uVar5 / 0x7f) / 0xfe) * -0xff +
                       (int)(((ulong)uVar5 / 0x7f) / 0xfe) + uVar5 / 0x7f) * 0x100 + 0x200 |
                      ((uVar5 / 0x7f) * 2 + (uVar5 / 0x7f) * -0x100 + iVar12) - 0x27f8);
      goto LAB_0022b4c2;
    }
  }
  uVar5 = ((length - (length + 1 >> 0x1f)) + 1U & 0xfffffffe) * 0x8000 + 0x800000 | uVar2;
  pcVar7 = digits + (long)length + -1;
  do {
    uVar9 = length;
    if (*pcVar7 != '\0') break;
    pcVar1 = pcVar7 + -1;
    pcVar7 = pcVar7 + -2;
    length = uVar9 - 2;
  } while (*pcVar1 == '\0');
  iVar12 = (int)*digits;
  uVar6 = 1;
  if ((uVar9 & 1) == 0) {
    iVar12 = (int)digits[1] + iVar12 * 10;
    uVar6 = 2;
  }
  iVar12 = iVar12 * 2;
  iVar10 = 8;
  if ((int)uVar6 < (int)uVar9) {
    uVar11 = (ulong)uVar6;
    do {
      if (iVar10 == 0) {
        if (((this->ceBuffer).length < 0x28) ||
           (UVar4 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,1,errorCode), UVar4 != '\0')) {
          iVar10 = (this->ceBuffer).length;
          (this->ceBuffer).length = iVar10 + 1;
          (this->ceBuffer).buffer.ptr[iVar10] = (ulong)(iVar12 + 0xbU | uVar5) << 0x20 | 0x5000500;
        }
        iVar10 = 0x10;
        uVar5 = uVar2;
      }
      else {
        bVar8 = (byte)iVar10;
        iVar10 = iVar10 + -8;
        uVar5 = iVar12 + 0xbU << (bVar8 & 0x1f) | uVar5;
      }
      pcVar7 = digits + uVar11;
      lVar3 = uVar11 + 1;
      uVar11 = uVar11 + 2;
      iVar12 = ((int)digits[lVar3] + *pcVar7 * 10) * 2;
    } while ((int)uVar11 < (int)uVar9);
  }
  uVar11 = (ulong)(iVar12 + 10 << ((byte)iVar10 & 0x1f) | uVar5);
LAB_0022b4c2:
  if ((0x27 < (this->ceBuffer).length) &&
     (UVar4 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,1,errorCode), UVar4 == '\0')) {
    return;
  }
  iVar12 = (this->ceBuffer).length;
  (this->ceBuffer).length = iVar12 + 1;
  (this->ceBuffer).buffer.ptr[iVar12] = uVar11 << 0x20 | 0x5000500;
  return;
}

Assistant:

void
CollationIterator::appendNumericSegmentCEs(const char *digits, int32_t length, UErrorCode &errorCode) {
    U_ASSERT(1 <= length && length <= 254);
    U_ASSERT(length == 1 || digits[0] != 0);
    uint32_t numericPrimary = data->numericPrimary;
    // Note: We use primary byte values 2..255: digits are not compressible.
    if(length <= 7) {
        // Very dense encoding for small numbers.
        int32_t value = digits[0];
        for(int32_t i = 1; i < length; ++i) {
            value = value * 10 + digits[i];
        }
        // Primary weight second byte values:
        //     74 byte values   2.. 75 for small numbers in two-byte primary weights.
        //     40 byte values  76..115 for medium numbers in three-byte primary weights.
        //     16 byte values 116..131 for large numbers in four-byte primary weights.
        //    124 byte values 132..255 for very large numbers with 4..127 digit pairs.
        int32_t firstByte = 2;
        int32_t numBytes = 74;
        if(value < numBytes) {
            // Two-byte primary for 0..73, good for day & month numbers etc.
            uint32_t primary = numericPrimary | ((firstByte + value) << 16);
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            return;
        }
        value -= numBytes;
        firstByte += numBytes;
        numBytes = 40;
        if(value < numBytes * 254) {
            // Three-byte primary for 74..10233=74+40*254-1, good for year numbers and more.
            uint32_t primary = numericPrimary |
                ((firstByte + value / 254) << 16) | ((2 + value % 254) << 8);
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            return;
        }
        value -= numBytes * 254;
        firstByte += numBytes;
        numBytes = 16;
        if(value < numBytes * 254 * 254) {
            // Four-byte primary for 10234..1042489=10234+16*254*254-1.
            uint32_t primary = numericPrimary | (2 + value % 254);
            value /= 254;
            primary |= (2 + value % 254) << 8;
            value /= 254;
            primary |= (firstByte + value % 254) << 16;
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            return;
        }
        // original value > 1042489
    }
    U_ASSERT(length >= 7);

    // The second primary byte value 132..255 indicates the number of digit pairs (4..127),
    // then we generate primary bytes with those pairs.
    // Omit trailing 00 pairs.
    // Decrement the value for the last pair.

    // Set the exponent. 4 pairs->132, 5 pairs->133, ..., 127 pairs->255.
    int32_t numPairs = (length + 1) / 2;
    uint32_t primary = numericPrimary | ((132 - 4 + numPairs) << 16);
    // Find the length without trailing 00 pairs.
    while(digits[length - 1] == 0 && digits[length - 2] == 0) {
        length -= 2;
    }
    // Read the first pair.
    uint32_t pair;
    int32_t pos;
    if(length & 1) {
        // Only "half a pair" if we have an odd number of digits.
        pair = digits[0];
        pos = 1;
    } else {
        pair = digits[0] * 10 + digits[1];
        pos = 2;
    }
    pair = 11 + 2 * pair;
    // Add the pairs of digits between pos and length.
    int32_t shift = 8;
    while(pos < length) {
        if(shift == 0) {
            // Every three pairs/bytes we need to store a 4-byte-primary CE
            // and start with a new CE with the '0' primary lead byte.
            primary |= pair;
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            primary = numericPrimary;
            shift = 16;
        } else {
            primary |= pair << shift;
            shift -= 8;
        }
        pair = 11 + 2 * (digits[pos] * 10 + digits[pos + 1]);
        pos += 2;
    }
    primary |= (pair - 1) << shift;
    ceBuffer.append(Collation::makeCE(primary), errorCode);
}